

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O3

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::RemoveDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  DeviceType Dev;
  long lVar2;
  string msg;
  undefined1 local_120 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_40;
  CreateInfo local_30;
  
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)local_120,(char (*) [29])"pSrcArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_120._0_8_,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xdc);
  }
  else {
    if (ppDstArchive != (IDataBlob **)0x0) {
      if (*ppDstArchive != (IDataBlob *)0x0) {
        FormatString<char[27]>((string *)local_120,(char (*) [27])"*ppDstArchive must be null");
        DebugAssertionFailed
                  ((Char *)local_120._0_8_,"RemoveDeviceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                   ,0xe4);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
      }
      local_30.ContentVersion = 0xffffffff;
      local_30.MakeCopy = false;
      local_30.pData = pSrcArchive;
      DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_120,&local_30);
      for (; DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE;
          DeviceFlags = DeviceFlags ^ -DeviceFlags & DeviceFlags) {
        Dev = ArchiveDeviceDataFlagToArchiveDeviceType(-DeviceFlags & DeviceFlags);
        DeviceObjectArchive::RemoveDeviceData((DeviceObjectArchive *)local_120,Dev);
      }
      DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_120,ppDstArchive);
      pIVar1 = *ppDstArchive;
      if (local_40.m_pObject != (IDataBlob *)0x0) {
        (*((local_40.m_pObject)->super_IObject)._vptr_IObject[2])();
        local_40.m_pObject = (IDataBlob *)0x0;
      }
      lVar2 = 200;
      do {
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
                  ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                   (local_120 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0x20);
      std::
      _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_120);
      return pIVar1 != (IDataBlob *)0x0;
    }
    FormatString<char[30]>((string *)local_120,(char (*) [30])"ppDstArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_120._0_8_,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xe1);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::RemoveDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.RemoveDeviceData(ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}